

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O3

void __thiscall
correctness_mul_div_randomized_Test::TestBody(correctness_mul_div_randomized_Test *this)

{
  pointer piVar1;
  pointer piVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  char *in_R9;
  long lVar8;
  size_t i;
  vector<int,_std::allocator<int>_> multipliers;
  AssertionResult gtest_ar_;
  big_integer accumulator;
  vector<int,_std::allocator<int>_> local_e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  internal local_c0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  ulong local_b0;
  AssertHelper local_a8;
  size_t *local_a0 [2];
  size_t local_90 [5];
  big_integer local_68;
  
  uVar7 = 0;
  do {
    local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    lVar8 = 1000;
    do {
      iVar4 = rand();
      local_68._0_4_ = iVar4 + -0x3fffffff + (uint)(iVar4 == 0x3fffffff);
      if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_68);
      }
      else {
        *local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_68._0_4_;
        local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    big_integer::big_integer(&local_68,1);
    lVar8 = 0;
    do {
      big_integer::big_integer
                ((big_integer *)local_a0,
                 local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8]);
      big_integer::operator*=(&local_68,(big_integer *)local_a0);
      big_integer::~big_integer((big_integer *)local_a0);
      piVar2 = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar1 = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 1000);
    local_b0 = uVar7;
    if ((local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) &&
       (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start + 1 !=
        local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      lVar8 = 4;
      do {
        iVar4 = rand();
        lVar5 = (long)iVar4 % ((lVar8 >> 2) + 1);
        if (lVar8 != lVar5 * 4) {
          iVar4 = *(int *)(lVar8 + (long)piVar1);
          *(int *)(lVar8 + (long)piVar1) = piVar1[lVar5];
          piVar1[lVar5] = iVar4;
        }
        lVar5 = lVar8 + 4;
        lVar8 = lVar8 + 4;
      } while ((int *)((long)piVar1 + lVar5) != piVar2);
    }
    uVar7 = local_b0;
    lVar8 = 1;
    do {
      big_integer::big_integer
                ((big_integer *)local_a0,
                 local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8]);
      big_integer::operator/=(&local_68,(big_integer *)local_a0);
      big_integer::~big_integer((big_integer *)local_a0);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 1000);
    big_integer::big_integer
              ((big_integer *)local_a0,
               *local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start);
    local_c0[0] = (internal)operator==(&local_68,(big_integer *)local_a0);
    local_b8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    big_integer::~big_integer((big_integer *)local_a0);
    if (local_c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,local_c0,(AssertionResult *)"accumulator == multipliers[0]",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
                 ,0x286,(char *)local_a0[0]);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if (local_a0[0] != local_90) {
        operator_delete(local_a0[0],local_90[0] + 1);
      }
      if (local_c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_c8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_c8.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    big_integer::~big_integer(&local_68);
    if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar6 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar6;
  } while (uVar6 != 10);
  return;
}

Assistant:

TEST(correctness, mul_div_randomized)
{
    for (unsigned itn = 0; itn != number_of_iterations; ++itn)
    {
        std::vector<int> multipliers;

        for (size_t i = 0; i != number_of_multipliers; ++i)
            multipliers.push_back(myrand());

        big_integer accumulator = 1;

        for (size_t i = 0; i != number_of_multipliers; ++i)
            accumulator *= multipliers[i];

        std::random_shuffle(multipliers.begin(), multipliers.end());

        for (size_t i = 1; i != number_of_multipliers; ++i) {
            accumulator /= multipliers[i];
        }

        EXPECT_TRUE(accumulator == multipliers[0]);
    }
}